

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O0

QFont * __thiscall QGnomeTheme::font(QGnomeTheme *this,Font type)

{
  QGnomeThemePrivate *gtkFontName;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QGnomeThemePrivate *d;
  undefined4 in_stack_ffffffffffffffc8;
  QFont *local_28;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  gtkFontName = d_func((QGnomeTheme *)0xae6d5e);
  if (gtkFontName->systemFont == (QFont *)0x0) {
    (**(code **)(*in_RDI + 0xa8))(local_20);
    QGnomeThemePrivate::configureFonts
              ((QGnomeThemePrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
               (QString *)gtkFontName);
    QString::~QString((QString *)0xae6da5);
  }
  if (in_ESI == 0) {
    local_28 = gtkFontName->systemFont;
  }
  else if (in_ESI == 0x17) {
    local_28 = gtkFontName->fixedFont;
  }
  else {
    local_28 = (QFont *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

const QFont *QGnomeTheme::font(Font type) const
{
    Q_D(const QGnomeTheme);
    if (!d->systemFont)
        d->configureFonts(gtkFontName());
    switch (type) {
    case QPlatformTheme::SystemFont:
        return d->systemFont;
    case QPlatformTheme::FixedFont:
        return d->fixedFont;
    default:
        return nullptr;
    }
}